

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O0

int check(FILE *fp,int argc,char **argv,png_uint_32p flags,display *d,int set_callback)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  png_uint_32 pVar4;
  png_structp ppVar5;
  png_infop ppVar6;
  char *pcVar7;
  long lVar8;
  byte local_90;
  byte local_84;
  uint local_70;
  uint local_6c;
  png_uint_32 y_1;
  png_uint_32 y;
  png_uint_32 wPass;
  png_uint_32 width;
  png_byte pStack_58;
  png_byte pStack_57;
  png_byte pStack_56;
  png_byte name [5];
  int option;
  int chunk;
  char *equals;
  uint local_40;
  png_uint_32 height;
  int ipass;
  int npasses;
  int i;
  int set_callback_local;
  display *d_local;
  png_uint_32p flags_local;
  char **argv_local;
  int argc_local;
  FILE *fp_local;
  
  d->keep = 0;
  d->before_IDAT = 0;
  d->after_IDAT = 0;
  ppVar5 = (png_structp)png_create_read_struct("1.6.48.git",d,error,warning);
  d->png_ptr = ppVar5;
  if (d->png_ptr == (png_structp)0x0) {
    fprintf(_stderr,"%s(%s): could not allocate png struct\n",d->file,d->test);
    exit(1);
  }
  ppVar6 = (png_infop)png_create_info_struct(d->png_ptr);
  d->info_ptr = ppVar6;
  ppVar6 = (png_infop)png_create_info_struct(d->png_ptr);
  d->end_ptr = ppVar6;
  if ((d->info_ptr == (png_infop)0x0) || (d->end_ptr == (png_infop)0x0)) {
    fprintf(_stderr,"%s(%s): could not allocate png info\n",d->file,d->test);
    clean_display(d);
    exit(1);
  }
  png_init_io(d->png_ptr,fp);
  if (set_callback != 0) {
    png_set_read_user_chunk_fn(d->png_ptr,d,read_callback);
  }
  ipass = 0;
  while( true ) {
    if (argc <= ipass) {
      png_read_info(d->png_ptr,d->info_ptr);
      cVar1 = png_get_interlace_type(d->png_ptr,d->info_ptr);
      if (cVar1 == '\0') {
        height = 1;
      }
      else {
        if (cVar1 != '\x01') {
          fprintf(_stderr,"%s(%s): invalid interlace type\n",d->file,d->test);
          clean_display(d);
          exit(1);
        }
        height = 7;
      }
      if (chunk_info[0].keep == 0) {
        png_start_read_image(d->png_ptr);
        uVar3 = png_get_image_height(d->png_ptr,d->info_ptr);
        if (height < 2) {
          for (local_70 = 0; local_70 < uVar3; local_70 = local_70 + 1) {
            png_read_row(d->png_ptr,0);
          }
        }
        else {
          iVar2 = png_get_image_width(d->png_ptr,d->info_ptr);
          for (local_40 = 0; (int)local_40 < (int)height; local_40 = local_40 + 1) {
            if ((int)local_40 < 2) {
              local_84 = 3;
            }
            else {
              local_84 = (byte)((int)(7 - local_40) >> 1);
            }
            if ((int)local_40 < 2) {
              local_90 = 3;
            }
            else {
              local_90 = (byte)((int)(7 - local_40) >> 1);
            }
            if (iVar2 + (((1 << (local_84 & 0x1f)) + -1) -
                        ((local_40 & 1) << (3U - (char)((int)(local_40 + 1) >> 1) & 0x1f) & 7)) >>
                (local_90 & 0x1f) != 0) {
              for (local_6c = 0; local_6c < uVar3; local_6c = local_6c + 1) {
                if (((int)(0x110145af >> (('\a' - (char)local_40) * '\x04' & 0x1fU) & 0xfU |
                          0x1145af0 >> (('\a' - (char)local_40) * '\x04' & 0x1fU) & 0xf0U) >>
                     ((byte)local_6c & 7) & 1U) != 0) {
                  png_read_row(d->png_ptr,0);
                }
              }
            }
          }
        }
      }
      png_read_end(d->png_ptr,d->end_ptr);
      pVar4 = get_valid(d,d->info_ptr);
      *flags = pVar4;
      pVar4 = get_unknown(d,d->info_ptr,0);
      flags[1] = pVar4;
      flags[(int)(uint)(chunk_info[0].keep != 0)] =
           flags[(int)(uint)(chunk_info[0].keep != 0)] | 0x8000;
      pVar4 = get_valid(d,d->end_ptr);
      flags[2] = pVar4;
      pVar4 = get_unknown(d,d->end_ptr,1);
      flags[3] = pVar4;
      clean_display(d);
      return d->keep;
    }
    pcVar7 = strchr(argv[ipass],0x3d);
    if (pcVar7 == (char *)0x0) break;
    iVar2 = strcmp(pcVar7 + 1,"default");
    if (iVar2 == 0) {
      pStack_58 = '\0';
      pStack_57 = '\0';
      pStack_56 = '\0';
      name[0] = '\0';
    }
    else {
      iVar2 = strcmp(pcVar7 + 1,"discard");
      if (iVar2 == 0) {
        pStack_58 = '\x01';
        pStack_57 = '\0';
        pStack_56 = '\0';
        name[0] = '\0';
      }
      else {
        iVar2 = strcmp(pcVar7 + 1,"if-safe");
        if (iVar2 == 0) {
          pStack_58 = '\x02';
          pStack_57 = '\0';
          pStack_56 = '\0';
          name[0] = '\0';
        }
        else {
          iVar2 = strcmp(pcVar7 + 1,"save");
          if (iVar2 != 0) {
            fprintf(_stderr,"%s(%s): %s: unrecognized chunk option\n",d->file,d->test,argv[ipass]);
            display_exit(d);
          }
          pStack_58 = '\x03';
          pStack_57 = '\0';
          pStack_56 = '\0';
          name[0] = '\0';
        }
      }
    }
    lVar8 = (long)pcVar7 - (long)argv[ipass];
    if (lVar8 == 3) {
      iVar2 = memcmp(argv[ipass],"all",3);
      if (iVar2 != 0) break;
      png_set_keep_unknown_chunks(d->png_ptr,_pStack_58,0,0xffffffff);
      d->keep = _pStack_58;
      name[1] = '\0';
      name[2] = '\0';
      name[3] = '\0';
      name[4] = '\0';
      for (; (int)name._1_4_ < 0x19; name._1_4_ = name._1_4_ + 1) {
        if (chunk_info[(int)name._1_4_].all != 0) {
          chunk_info[(int)name._1_4_].keep = _pStack_58;
        }
      }
    }
    else if (lVar8 == 4) {
      name._1_4_ = find(argv[ipass]);
      if ((int)name._1_4_ < 0) break;
      unique0x00011f80 = *(undefined4 *)chunk_info[(int)name._1_4_].name;
      width._3_1_ = chunk_info[(int)name._1_4_].name[4];
      png_set_keep_unknown_chunks(d->png_ptr,_pStack_58,(long)&wPass + 3,1);
      chunk_info[(int)name._1_4_].keep = _pStack_58;
    }
    else {
      if ((lVar8 != 7) || (iVar2 = memcmp(argv[ipass],"default",7), iVar2 != 0)) break;
      png_set_keep_unknown_chunks(d->png_ptr,_pStack_58,0,0);
      d->keep = _pStack_58;
    }
    ipass = ipass + 1;
  }
  fprintf(_stderr,"%s(%s): %s: unrecognized chunk argument\n",d->file,d->test,argv[ipass]);
  display_exit(d);
}

Assistant:

static int
check(FILE *fp, int argc, const char **argv, png_uint_32p flags/*out*/,
   display *d, int set_callback)
{
   int i, npasses, ipass;
   png_uint_32 height;

   d->keep = PNG_HANDLE_CHUNK_AS_DEFAULT;
   d->before_IDAT = 0;
   d->after_IDAT = 0;

   /* Some of these errors are permanently fatal and cause an exit here, others
    * are per-test and cause an error return.
    */
   d->png_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING, d, error,
      warning);
   if (d->png_ptr == NULL)
   {
      fprintf(stderr, "%s(%s): could not allocate png struct\n", d->file,
         d->test);
      /* Terminate here, this error is not test specific. */
      exit(1);
   }

   d->info_ptr = png_create_info_struct(d->png_ptr);
   d->end_ptr = png_create_info_struct(d->png_ptr);
   if (d->info_ptr == NULL || d->end_ptr == NULL)
   {
      fprintf(stderr, "%s(%s): could not allocate png info\n", d->file,
         d->test);
      clean_display(d);
      exit(1);
   }

   png_init_io(d->png_ptr, fp);

#  ifdef PNG_READ_USER_CHUNKS_SUPPORTED
      /* This is only done if requested by the caller; it interferes with the
       * standard store/save mechanism.
       */
      if (set_callback)
         png_set_read_user_chunk_fn(d->png_ptr, d, read_callback);
#  else
      UNUSED(set_callback)
#  endif

   /* Handle each argument in turn; multiple settings are possible for the same
    * chunk and multiple calls will occur (the last one should override all
    * preceding ones).
    */
   for (i=0; i<argc; ++i)
   {
      const char *equals = strchr(argv[i], '=');

      if (equals != NULL)
      {
         int chunk, option;

         if (strcmp(equals+1, "default") == 0)
            option = PNG_HANDLE_CHUNK_AS_DEFAULT;
         else if (strcmp(equals+1, "discard") == 0)
            option = PNG_HANDLE_CHUNK_NEVER;
         else if (strcmp(equals+1, "if-safe") == 0)
            option = PNG_HANDLE_CHUNK_IF_SAFE;
         else if (strcmp(equals+1, "save") == 0)
            option = PNG_HANDLE_CHUNK_ALWAYS;
         else
         {
            fprintf(stderr, "%s(%s): %s: unrecognized chunk option\n", d->file,
               d->test, argv[i]);
            display_exit(d);
         }

         switch (equals - argv[i])
         {
            case 4: /* chunk name */
               chunk = find(argv[i]);

               if (chunk >= 0)
               {
                  /* These #if tests have the effect of skipping the arguments
                   * if SAVE support is unavailable - we can't do a useful test
                   * in this case, so we just check the arguments!  This could
                   * be improved in the future by using the read callback.
                   */
#                 if PNG_LIBPNG_VER >= 10700 &&\
                     !defined(PNG_SAVE_UNKNOWN_CHUNKS_SUPPORTED)
                     if (option < PNG_HANDLE_CHUNK_IF_SAFE)
#                 endif /* 1.7+ SAVE_UNKNOWN_CHUNKS */
                  {
                     png_byte name[5];

                     memcpy(name, chunk_info[chunk].name, 5);
                     png_set_keep_unknown_chunks(d->png_ptr, option, name, 1);
                     chunk_info[chunk].keep = option;
                  }
                  continue;
               }

               break;

            case 7: /* default */
               if (memcmp(argv[i], "default", 7) == 0)
               {
#                 if PNG_LIBPNG_VER >= 10700 &&\
                     !defined(PNG_SAVE_UNKNOWN_CHUNKS_SUPPORTED)
                     if (option < PNG_HANDLE_CHUNK_IF_SAFE)
#                 endif /* 1.7+ SAVE_UNKNOWN_CHUNKS */
                     png_set_keep_unknown_chunks(d->png_ptr, option, NULL, 0);

                  d->keep = option;
                  continue;
               }

               break;

            case 3: /* all */
               if (memcmp(argv[i], "all", 3) == 0)
               {
#                 if PNG_LIBPNG_VER >= 10700 &&\
                     !defined(PNG_SAVE_UNKNOWN_CHUNKS_SUPPORTED)
                     if (option < PNG_HANDLE_CHUNK_IF_SAFE)
#                 endif /* 1.7+ SAVE_UNKNOWN_CHUNKS */
                     png_set_keep_unknown_chunks(d->png_ptr, option, NULL, -1);

                  d->keep = option;

                  for (chunk = 0; chunk < NINFO; ++chunk)
                     if (chunk_info[chunk].all)
                        chunk_info[chunk].keep = option;
                  continue;
               }

               break;

            default: /* some misplaced = */

               break;
         }
      }

      fprintf(stderr, "%s(%s): %s: unrecognized chunk argument\n", d->file,
         d->test, argv[i]);
      display_exit(d);
   }

   png_read_info(d->png_ptr, d->info_ptr);

   switch (png_get_interlace_type(d->png_ptr, d->info_ptr))
   {
      case PNG_INTERLACE_NONE:
         npasses = 1;
         break;

      case PNG_INTERLACE_ADAM7:
         npasses = PNG_INTERLACE_ADAM7_PASSES;
         break;

      default:
         /* Hard error because it is not test specific */
         fprintf(stderr, "%s(%s): invalid interlace type\n", d->file, d->test);
         clean_display(d);
         exit(1);
   }

   /* Skip the image data, if IDAT is not being handled then don't do this
    * because it will cause a CRC error.
    */
   if (chunk_info[0/*IDAT*/].keep == PNG_HANDLE_CHUNK_AS_DEFAULT)
   {
      png_start_read_image(d->png_ptr);
      height = png_get_image_height(d->png_ptr, d->info_ptr);

      if (npasses > 1)
      {
         png_uint_32 width = png_get_image_width(d->png_ptr, d->info_ptr);

         for (ipass=0; ipass<npasses; ++ipass)
         {
            png_uint_32 wPass = PNG_PASS_COLS(width, ipass);

            if (wPass > 0)
            {
               png_uint_32 y;

               for (y=0; y<height; ++y)
                  if (PNG_ROW_IN_INTERLACE_PASS(y, ipass))
                     png_read_row(d->png_ptr, NULL, NULL);
            }
         }
      } /* interlaced */

      else /* not interlaced */
      {
         png_uint_32 y;

         for (y=0; y<height; ++y)
            png_read_row(d->png_ptr, NULL, NULL);
      }
   }

   png_read_end(d->png_ptr, d->end_ptr);

   flags[0] = get_valid(d, d->info_ptr);
   flags[1] = get_unknown(d, d->info_ptr, 0/*before IDAT*/);

   /* Only png_read_png sets PNG_INFO_IDAT! */
   flags[chunk_info[0/*IDAT*/].keep != PNG_HANDLE_CHUNK_AS_DEFAULT] |=
      PNG_INFO_IDAT;

   flags[2] = get_valid(d, d->end_ptr);
   flags[3] = get_unknown(d, d->end_ptr, 1/*after IDAT*/);

   clean_display(d);

   return d->keep;
}